

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

ly_set * ly_ctx_find_path(ly_ctx *ctx,char *path)

{
  ly_ctx *local_28;
  ly_set *resultset;
  char *path_local;
  ly_ctx *ctx_local;
  
  local_28 = (ly_ctx *)0x0;
  resultset = (ly_set *)path;
  path_local = (char *)ctx;
  if ((ctx == (ly_ctx *)0x0) || (path == (char *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","ly_ctx_find_path");
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    resolve_schema_nodeid(path,(lys_node *)0x0,*(ctx->models).list,(ly_set **)&local_28,1,1);
    ctx_local = local_28;
  }
  return (ly_set *)ctx_local;
}

Assistant:

ly_set *
ly_ctx_find_path(struct ly_ctx *ctx, const char *path)
{
    struct ly_set *resultset = NULL;

    if (!ctx || !path) {
        LOGARG;
        return NULL;
    }

    /* start in internal module without data to make sure that all the nodes are prefixed */
    resolve_schema_nodeid(path, NULL, ctx->models.list[0], &resultset, 1, 1);
    return resultset;
}